

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

pair<int,_int> mxx::min_element<int>(int *x,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Comm poVar2;
  pair<int,_int> pVar3;
  int local_38;
  int iStack_34;
  anon_struct_8_2_006ded16 out;
  anon_struct_8_2_006ded16 in;
  MPI_Datatype dt;
  comm *comm_local;
  int *x_local;
  
  poVar1 = datatype_pair<int>::get_type();
  out.value = *x;
  out.rank = mxx::comm::rank(comm);
  poVar2 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
  MPI_Allreduce(&out,&local_38,1,poVar1,&ompi_mpi_op_minloc,poVar2);
  pVar3 = std::make_pair<int&,int&>(&local_38,&iStack_34);
  return pVar3;
}

Assistant:

inline std::pair<T, int> min_element(const T& x, const mxx::comm& comm = mxx::comm()) {
    if (mxx::is_builtin_pair_type<T>::value) {
        MPI_Datatype dt = mxx::datatype_pair<T>::get_type();
        struct {
            T value;
            int rank;
        } in, out;
        in.value = x;
        in.rank = comm.rank();
        MPI_Allreduce(&in, &out, 1, dt, MPI_MINLOC, comm);
        return std::make_pair(out.value, out.rank);
    } else {
        // use custom operator
        std::pair<T, int> in = std::make_pair(x, comm.rank());
        return mxx::allreduce(in, [](const std::pair<T, int>& x, const std::pair<T, int>& y) { return x.first > y.first ? y : x;}, comm);
    }
}